

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdChroma::~MthdChroma(MthdChroma *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			exp.chroma = pgraph_to_a1r10g10b10(pgraph_expand_color(&exp, val));
		} else {
			if (cls == 0x17)
				nv04_pgraph_set_chroma_nv01(&exp, val);
			else
				exp.chroma = val;
		}
	}